

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

NativeEntryPointData * __thiscall
Js::EntryPointInfo::EnsureNativeEntryPointData(EntryPointInfo *this)

{
  NativeEntryPointData **ppNVar1;
  ScriptContext *this_00;
  Recycler *pRVar2;
  InProcNativeEntryPointData *this_01;
  TrackAllocData local_40;
  InProcNativeEntryPointData *local_18;
  NativeEntryPointData *data;
  EntryPointInfo *this_local;
  
  data = (NativeEntryPointData *)this;
  ppNVar1 = Memory::WriteBarrierPtr::operator_cast_to_NativeEntryPointData__
                      ((WriteBarrierPtr *)&this->nativeEntryPointData);
  local_18 = (InProcNativeEntryPointData *)*ppNVar1;
  if (local_18 == (InProcNativeEntryPointData *)0x0) {
    this_00 = GetScriptContext(this);
    pRVar2 = ScriptContext::GetRecycler(this_00);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&InProcNativeEntryPointData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x2044);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_40);
    this_01 = (InProcNativeEntryPointData *)new<Memory::Recycler>(0xe0,pRVar2,0x43c4b0);
    InProcNativeEntryPointData::InProcNativeEntryPointData(this_01);
    local_18 = this_01;
    Memory::WriteBarrierPtr<NativeEntryPointData>::operator=
              (&this->nativeEntryPointData,(NativeEntryPointData *)this_01);
  }
  return &local_18->super_NativeEntryPointData;
}

Assistant:

NativeEntryPointData * EntryPointInfo::EnsureNativeEntryPointData()
    {
        NativeEntryPointData * data = this->nativeEntryPointData;
        if (data == nullptr)
        {
#if ENABLE_OOP_NATIVE_CODEGEN
            if (JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), OOPNativeEntryPointData);
            }
            else
#endif
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), InProcNativeEntryPointData);
            }
            this->nativeEntryPointData = data;
        }
        return data;
    }